

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterA.c
# Opt level: O0

Aig_Man_t * Inta_ManDeriveClauses(Inta_Man_t *pMan,Sto_Man_t *pCnf,int fClausesA)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *p_00;
  Aig_Obj_t *pAVar3;
  bool bVar4;
  int local_54;
  int v;
  int VarAB;
  int Var;
  Sto_Cls_t *pClause;
  Aig_Obj_t *pLit;
  Aig_Obj_t *pSum;
  Aig_Obj_t *pMiter;
  Aig_Man_t *p;
  int fClausesA_local;
  Sto_Man_t *pCnf_local;
  Inta_Man_t *pMan_local;
  
  p_00 = Aig_ManStart(10000);
  pSum = Aig_ManConst1(p_00);
  _VarAB = pCnf->pHead;
  while( true ) {
    bVar4 = false;
    if (_VarAB != (Sto_Cls_t *)0x0) {
      bVar4 = (*(uint *)&_VarAB->field_0x1c >> 1 & 1) != 0;
    }
    if (!bVar4) break;
    if (fClausesA == (*(uint *)&_VarAB->field_0x1c & 1)) {
      pLit = Aig_ManConst0(p_00);
      for (local_54 = 0; local_54 < (int)(*(uint *)&_VarAB->field_0x1c >> 3 & 0xffffff);
          local_54 = local_54 + 1) {
        iVar1 = lit_var(*(lit *)((long)&_VarAB[1].pNext + (long)local_54 * 4));
        if (pMan->pVarTypes[iVar1] < 0) {
          iVar1 = -1 - pMan->pVarTypes[iVar1];
          if ((iVar1 < 0) || (iVar2 = Vec_IntSize(pMan->vVarsAB), iVar2 <= iVar1)) {
            __assert_fail("VarAB >= 0 && VarAB < Vec_IntSize(pMan->vVarsAB)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterA.c"
                          ,0x42f,"Aig_Man_t *Inta_ManDeriveClauses(Inta_Man_t *, Sto_Man_t *, int)")
            ;
          }
          pAVar3 = Aig_IthVar(p_00,iVar1);
          iVar1 = lit_sign(*(lit *)((long)&_VarAB[1].pNext + (long)local_54 * 4));
          pClause = (Sto_Cls_t *)Aig_NotCond(pAVar3,iVar1);
        }
        else {
          iVar2 = Vec_IntSize(pMan->vVarsAB);
          pAVar3 = Aig_IthVar(p_00,iVar2 + 1 + iVar1);
          iVar1 = lit_sign(*(lit *)((long)&_VarAB[1].pNext + (long)local_54 * 4));
          pClause = (Sto_Cls_t *)Aig_NotCond(pAVar3,iVar1);
        }
        pLit = Aig_Or(p_00,pLit,(Aig_Obj_t *)pClause);
      }
      pSum = Aig_And(p_00,pSum,pLit);
    }
    _VarAB = _VarAB->pNext;
  }
  Aig_ObjCreateCo(p_00,pSum);
  return p_00;
}

Assistant:

Aig_Man_t * Inta_ManDeriveClauses( Inta_Man_t * pMan, Sto_Man_t * pCnf, int fClausesA )
{
    Aig_Man_t * p;
    Aig_Obj_t * pMiter, * pSum, * pLit;
    Sto_Cls_t * pClause;
    int Var, VarAB, v;
    p = Aig_ManStart( 10000 );
    pMiter = Aig_ManConst1(p);
    Sto_ManForEachClauseRoot( pCnf, pClause )
    {
        if ( fClausesA ^ pClause->fA ) // clause of B
            continue;
        // clause of A
        pSum = Aig_ManConst0(p);
        for ( v = 0; v < (int)pClause->nLits; v++ )
        {
            Var = lit_var(pClause->pLits[v]);
            if ( pMan->pVarTypes[Var] < 0 ) // global var
            {
                VarAB = -pMan->pVarTypes[Var]-1;
                assert( VarAB >= 0 && VarAB < Vec_IntSize(pMan->vVarsAB) );
                pLit = Aig_NotCond( Aig_IthVar(p, VarAB), lit_sign(pClause->pLits[v]) );
            }
            else
                pLit = Aig_NotCond( Aig_IthVar(p, Vec_IntSize(pMan->vVarsAB)+1+Var), lit_sign(pClause->pLits[v]) );
            pSum = Aig_Or( p, pSum, pLit );
        }
        pMiter = Aig_And( p, pMiter, pSum );
    }
    Aig_ObjCreateCo( p, pMiter );
    return p;
}